

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::lead_node(CTcEmbedBuilderDbl *this)

{
  CTcToken *pCVar1;
  size_t sVar2;
  CTcTokenizer **str;
  CTPNDstr *this_00;
  CTPNDstr *local_8;
  
  pCVar1 = CTcTokenizer::getcur(G_tok);
  sVar2 = CTcToken::get_text_len(pCVar1);
  if (sVar2 == 0) {
    local_8 = (CTPNDstr *)0x0;
  }
  else {
    local_8 = (CTPNDstr *)CTcPrsAllocObj::operator_new(0x263824);
    str = &G_tok;
    this_00 = local_8;
    pCVar1 = CTcTokenizer::getcur(G_tok);
    CTcToken::get_text(pCVar1);
    pCVar1 = CTcTokenizer::getcur(*str);
    CTcToken::get_text_len(pCVar1);
    CTPNDstr::CTPNDstr(this_00,(char *)str,(size_t)local_8);
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

virtual CTcPrsNode *lead_node()
    {
        /* 
         *   Create a node for the initial part of the string.  This is just
         *   an ordinary double-quoted string node. If the initial part of
         *   the string is zero-length, don't create an initial node at all,
         *   since this would just generate do-nothing code.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            /* create the node for the initial part of the string */
            return new CTPNDstr(G_tok->getcur()->get_text(),
                                G_tok->getcur()->get_text_len());
        }
        else
        {
            /* 
             *   the initial part of the string is empty, so we don't need a
             *   node for this portion 
             */
            return 0;
        }
    }